

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

UniValue * __thiscall
RPCHelpMan::Arg<UniValue>(UniValue *__return_storage_ptr__,RPCHelpMan *this,string_view key)

{
  long lVar1;
  pointer pcVar2;
  size_t i;
  UniValue *pUVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = GetParamIndex(this,key);
  pUVar3 = ArgValue<UniValue_const&>(this,i);
  __return_storage_ptr__->typ = pUVar3->typ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  pcVar2 = (pUVar3->val)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->val,pcVar2,pcVar2 + (pUVar3->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->keys,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector
            (&__return_storage_ptr__->values,&pUVar3->values);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto Arg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return argument (required or with default value).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value.
            return ArgValue<R>(i);
        } else {
            // Return everything else by reference.
            return ArgValue<const R&>(i);
        }
    }